

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::truncF32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *this_01;
  long lVar1;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  undefined1 local_c0 [8];
  LaneArray<4> lanes;
  Literal local_48;
  
  getLanesF32x4((LaneArray<4> *)local_c0,this);
  lVar1 = 0;
  this_00 = &lanes._M_elems[3].type;
  __x = extraout_XMM0_Qa;
  do {
    this_01 = (Literal *)(local_c0 + lVar1);
    trunc(&local_48,__x);
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
    __x = extraout_XMM0_Qa_00;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)local_c0);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncF32x4() const {
  return unary<4, &Literal::getLanesF32x4, &Literal::trunc>(*this);
}